

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::GenerateInitSavedDefaultCode
          (AccessorPrimitiveFieldGenerator *this,Printer *printer)

{
  const_iterator cVar1;
  allocator<char> local_41;
  key_type local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"default_constant",&local_41);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->variables_)._M_t,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->variables_)._M_t._M_impl.super__Rb_tree_header) {
    io::Printer::Print(printer,&this->variables_,"$default_constant$ = $default_constant_value$;\n")
    ;
  }
  return;
}

Assistant:

void AccessorPrimitiveFieldGenerator::
GenerateInitSavedDefaultCode(io::Printer* printer) const {
  if (variables_.find("default_constant") != variables_.end()) {
    printer->Print(variables_,
      "$default_constant$ = $default_constant_value$;\n");
  }
}